

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

NewOrderSingle * __thiscall
Application::queryNewOrderSingle50(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  Application *this_00;
  FieldBase *pFVar2;
  OrdType ordType;
  FieldBase local_1d0;
  undefined1 local_178 [48];
  _Alloc_hider local_148;
  size_type local_140;
  field_metrics local_128;
  FieldBase local_120;
  FieldBase local_c8;
  FieldBase local_70;
  
  this_00 = (Application *)0x28;
  FIX::CharField::CharField((CharField *)local_178,0x28);
  local_178._0_8_ = &PTR__FieldBase_00152008;
  queryClOrdID((ClOrdID *)&local_1d0,this_00);
  querySide((Side *)&local_70,this_00);
  FIX::TransactTime::TransactTime((TransactTime *)&local_c8);
  queryOrdType((OrdType *)&local_120,this_00);
  local_178._8_4_ = local_120.m_tag;
  std::__cxx11::string::_M_assign((string *)(local_178 + 0x10));
  local_128 = local_120.m_metrics;
  local_140 = 0;
  *local_148._M_p = '\0';
  FIX50::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)&local_1d0,(Side *)&local_70,
             (TransactTime *)&local_c8,(OrdType *)local_178);
  FIX::FieldBase::~FieldBase(&local_120);
  FIX::FieldBase::~FieldBase(&local_c8);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::FieldBase::~FieldBase(&local_1d0);
  FIX::CharField::CharField((CharField *)&local_1d0,0x15,'1');
  pFVar2 = &local_1d0;
  local_1d0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00152078;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,pFVar2,true);
  FIX::FieldBase::~FieldBase(&local_1d0);
  querySymbol((Symbol *)&local_1d0,(Application *)pFVar2);
  pFVar2 = &local_1d0;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,pFVar2,true);
  FIX::FieldBase::~FieldBase(&local_1d0);
  queryOrderQty((OrderQty *)&local_1d0,(Application *)pFVar2);
  pFVar2 = &local_1d0;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,pFVar2,true);
  FIX::FieldBase::~FieldBase(&local_1d0);
  queryTimeInForce((TimeInForce *)&local_1d0,(Application *)pFVar2);
  pFVar2 = &local_1d0;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,pFVar2,true);
  FIX::FieldBase::~FieldBase(&local_1d0);
  cVar1 = FIX::CharField::getValue((CharField *)local_178);
  if (cVar1 == '2') {
LAB_00112751:
    queryPrice((Price *)&local_1d0,(Application *)pFVar2);
    pFVar2 = &local_1d0;
    FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,pFVar2,true);
    FIX::FieldBase::~FieldBase(&local_1d0);
  }
  else {
    cVar1 = FIX::CharField::getValue((CharField *)local_178);
    if (cVar1 == '4') goto LAB_00112751;
  }
  cVar1 = FIX::CharField::getValue((CharField *)local_178);
  if (cVar1 != '3') {
    cVar1 = FIX::CharField::getValue((CharField *)local_178);
    if (cVar1 != '4') goto LAB_001127b9;
  }
  queryStopPx((StopPx *)&local_1d0,(Application *)pFVar2);
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_1d0,true);
  FIX::FieldBase::~FieldBase(&local_1d0);
LAB_001127b9:
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::FieldBase::~FieldBase((FieldBase *)local_178);
  return __return_storage_ptr__;
}

Assistant:

FIX50::NewOrderSingle Application::queryNewOrderSingle50() {
  FIX::OrdType ordType;

  FIX50::NewOrderSingle newOrderSingle(queryClOrdID(), querySide(), FIX::TransactTime(), ordType = queryOrdType());

  newOrderSingle.set(FIX::HandlInst('1'));
  newOrderSingle.set(querySymbol());
  newOrderSingle.set(queryOrderQty());
  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}